

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::addSatSI8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  if (((this->type).id == 2) && ((other->type).id == 2)) {
    bVar2 = (this->field_0).v128[0];
    bVar1 = (other->field_0).v128[0] + bVar2;
    bVar3 = 0x7f - ((char)bVar2 >> 7);
    if (-1 < (char)((bVar1 ^ bVar2) & ((other->field_0).v128[0] ^ bVar1))) {
      bVar3 = bVar1;
    }
    *(int *)&__return_storage_ptr__->field_0 = (int)(char)bVar3;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x120,"int32_t wasm::Literal::geti32() const");
}

Assistant:

Literal Literal::addSatSI8(const Literal& other) const {
  return Literal(add_sat_s<int8_t>(geti32(), other.geti32()));
}